

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::EtcDecompressInternal::decompressEAC11Block
               (deUint8 *dst,deUint64 src,bool signedMode)

{
  deUint32 dVar1;
  deUint32 dVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  int iVar7;
  undefined2 local_48;
  undefined2 local_46;
  deUint16 value_1;
  deInt16 value;
  int modifier;
  deUint32 modifierNdx;
  int pixelBitNdx;
  int dstOffset;
  int y;
  int x;
  int pixelNdx;
  deInt32 baseCodeword;
  deInt32 tableNdx;
  deInt32 multiplier;
  bool signedMode_local;
  deUint64 src_local;
  deUint8 *dst_local;
  
  dVar1 = getBits(src,0x34,0x37);
  dVar2 = getBits(src,0x30,0x33);
  x = getBits(src,0x38,0x3f);
  if (signedMode) {
    if (0x7f < x) {
      x = x - 0x100;
    }
    if (x == -0x80) {
      x = -0x7f;
    }
  }
  for (y = 0; y < 0x10; y = y + 1) {
    iVar3 = ((y % 4) * 4 + y / 4) * 2;
    iVar7 = y * -3;
    dVar4 = getBit(src,iVar7 + 0x2f);
    dVar5 = getBit(src,iVar7 + 0x2e);
    dVar6 = getBit(src,iVar7 + 0x2d);
    iVar7 = decompressEAC11Block::modifierTable[(int)dVar2][dVar4 << 2 | dVar5 << 1 | dVar6];
    if (signedMode) {
      if (dVar1 == 0) {
        iVar7 = ::deClamp32(x * 8 + iVar7,-0x3ff,0x3ff);
        local_46 = (undefined2)iVar7;
      }
      else {
        iVar7 = ::deClamp32(x * 8 + dVar1 * iVar7 * 8,-0x3ff,0x3ff);
        local_46 = (undefined2)iVar7;
      }
      *(undefined2 *)(dst + iVar3) = local_46;
    }
    else {
      if (dVar1 == 0) {
        iVar7 = ::deClamp32(x * 8 + 4 + iVar7,0,0x7ff);
        local_48 = (undefined2)iVar7;
      }
      else {
        iVar7 = ::deClamp32(x * 8 + 4 + dVar1 * iVar7 * 8,0,0x7ff);
        local_48 = (undefined2)iVar7;
      }
      *(undefined2 *)(dst + iVar3) = local_48;
    }
  }
  return;
}

Assistant:

void decompressEAC11Block (deUint8 dst[ETC2_UNCOMPRESSED_BLOCK_SIZE_R11], deUint64 src, bool signedMode)
{
	static const int modifierTable[16][8] =
	{
		{-3,  -6,  -9, -15,  2,  5,  8, 14},
		{-3,  -7, -10, -13,  2,  6,  9, 12},
		{-2,  -5,  -8, -13,  1,  4,  7, 12},
		{-2,  -4,  -6, -13,  1,  3,  5, 12},
		{-3,  -6,  -8, -12,  2,  5,  7, 11},
		{-3,  -7,  -9, -11,  2,  6,  8, 10},
		{-4,  -7,  -8, -11,  3,  6,  7, 10},
		{-3,  -5,  -8, -11,  2,  4,  7, 10},
		{-2,  -6,  -8, -10,  1,  5,  7,  9},
		{-2,  -5,  -8, -10,  1,  4,  7,  9},
		{-2,  -4,  -8, -10,  1,  3,  7,  9},
		{-2,  -5,  -7, -10,  1,  4,  6,  9},
		{-3,  -4,  -7, -10,  2,  3,  6,  9},
		{-1,  -2,  -3, -10,  0,  1,  2,  9},
		{-4,  -6,  -8,  -9,  3,  5,  7,  8},
		{-3,  -5,  -7,  -9,  2,  4,  6,  8}
	};

	const deInt32 multiplier	= (deInt32)getBits(src, 52, 55);
	const deInt32 tableNdx		= (deInt32)getBits(src, 48, 51);
	deInt32 baseCodeword		= (deInt32)getBits(src, 56, 63);

	if (signedMode)
	{
		if (baseCodeword > 127)
			baseCodeword -= 256;
		if (baseCodeword == -128)
			baseCodeword = -127;
	}

	for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
	{
		const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
		const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
		const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_R11;
		const int		pixelBitNdx		= 45 - 3*pixelNdx;
		const deUint32	modifierNdx		= (getBit(src, pixelBitNdx + 2) << 2) | (getBit(src, pixelBitNdx + 1) << 1) | getBit(src, pixelBitNdx);
		const int		modifier		= modifierTable[tableNdx][modifierNdx];

		if (signedMode)
		{
			deInt16 value;

			if (multiplier != 0)
				value = (deInt16)deClamp32(baseCodeword*8 + multiplier*modifier*8, -1023, 1023);
			else
				value = (deInt16)deClamp32(baseCodeword*8 + modifier, -1023, 1023);

			*((deInt16*)(dst + dstOffset)) = value;
		}
		else
		{
			deUint16 value;

			if (multiplier != 0)
				value = (deUint16)deClamp32(baseCodeword*8 + 4 + multiplier*modifier*8, 0, 2047);
			else
				value= (deUint16)deClamp32(baseCodeword*8 + 4 + modifier, 0, 2047);

			*((deUint16*)(dst + dstOffset)) = value;
		}
	}
}